

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

int __thiscall ON_Displacement::FindSubItemArrayIndex(ON_Displacement *this,int face_index)

{
  int iVar1;
  SubItem **ppSVar2;
  SubItem *sub;
  int i;
  int face_index_local;
  ON_Displacement *this_local;
  
  sub._0_4_ = 0;
  while( true ) {
    iVar1 = ON_SimpleArray<ON_Displacement::SubItem_*>::Count(&this->m_impl_dsp->m_subs);
    if (iVar1 <= (int)sub) {
      return -1;
    }
    ppSVar2 = ON_SimpleArray<ON_Displacement::SubItem_*>::operator[]
                        (&this->m_impl_dsp->m_subs,(int)sub);
    iVar1 = SubItem::FaceIndex(*ppSVar2);
    if (iVar1 == face_index) break;
    sub._0_4_ = (int)sub + 1;
  }
  return (int)sub;
}

Assistant:

int ON_Displacement::FindSubItemArrayIndex(int face_index) const
{
  for (int i = 0; i < m_impl_dsp->m_subs.Count(); i++)
  {
    const auto* sub = m_impl_dsp->m_subs[i];
    if (sub->FaceIndex() == face_index)
      return i;
  }

  return -1;
}